

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_cart_box_dist(REF_DBL *box_geom,REF_DBL *p,REF_DBL *dist)

{
  double dVar1;
  int local_24;
  REF_INT i;
  REF_DBL *dist_local;
  REF_DBL *p_local;
  REF_DBL *box_geom_local;
  
  *dist = 0.0;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    if (p[local_24] < box_geom[local_24]) {
      dVar1 = pow(p[local_24] - box_geom[local_24],2.0);
      *dist = dVar1 + *dist;
    }
    if (box_geom[local_24 + 3] <= p[local_24] && p[local_24] != box_geom[local_24 + 3]) {
      dVar1 = pow(p[local_24] - box_geom[local_24 + 3],2.0);
      *dist = dVar1 + *dist;
    }
  }
  dVar1 = sqrt(*dist);
  *dist = dVar1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_cart_box_dist(REF_DBL *box_geom,
                                                   REF_DBL *p, REF_DBL *dist) {
  REF_INT i;
  /* distance to box, zero inside box */
  *dist = 0;
  for (i = 0; i < 3; i++) {
    if (p[i] < box_geom[i]) (*dist) += pow(p[i] - box_geom[i], 2);
    if (p[i] > box_geom[i + 3]) (*dist) += pow(p[i] - box_geom[i + 3], 2);
  }
  (*dist) = sqrt(*dist);
  return REF_SUCCESS;
}